

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O3

int nn_xpush_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase *self;
  int iVar1;
  
  iVar1 = 0x198;
  self = (nn_sockbase *)nn_alloc_(0x198);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xpush_sockbase_vfptr,hint);
    nn_lb_init((nn_lb *)(self + 1));
    *sockbase = self;
    return 0;
  }
  nn_xpush_create_cold_1();
  return (int)(iVar1 == 0x51);
}

Assistant:

int nn_xpush_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpush *self;

    self = nn_alloc (sizeof (struct nn_xpush), "socket (push)");
    alloc_assert (self);
    nn_xpush_init (self, &nn_xpush_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}